

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

int dbuf_printf(DynBuf *s,char *fmt,...)

{
  uint uVar1;
  int iVar2;
  DynBuf *in_RDX;
  char *in_RSI;
  long *in_RDI;
  int len;
  char buf [128];
  va_list ap;
  size_t in_stack_fffffffffffffe88;
  uint8_t *in_stack_fffffffffffffe90;
  char local_b8 [128];
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  long *local_10;
  int local_4;
  
  local_28 = &stack0xfffffffffffffe88;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar1 = vsnprintf(local_b8,0x80,in_RSI,&local_38);
  if (uVar1 < 0x80) {
    local_4 = dbuf_put(in_RDX,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  else {
    iVar2 = dbuf_realloc(in_RDX,(size_t)in_stack_fffffffffffffe90);
    if (iVar2 == 0) {
      local_30 = &stack0x00000008;
      local_34 = 0x30;
      local_38 = 0x10;
      local_28 = &stack0xfffffffffffffe88;
      vsnprintf((char *)(*local_10 + local_10[1]),local_10[2] - local_10[1],local_18,&local_38);
      local_10[1] = (long)(int)uVar1 + local_10[1];
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int __attribute__((format(printf, 2, 3))) dbuf_printf(DynBuf *s,
                                                      const char *fmt, ...)
{
    va_list ap;
    char buf[128];
    int len;
    
    va_start(ap, fmt);
    len = vsnprintf(buf, sizeof(buf), fmt, ap);
    va_end(ap);
    if (len < sizeof(buf)) {
        /* fast case */
        return dbuf_put(s, (uint8_t *)buf, len);
    } else {
        if (dbuf_realloc(s, s->size + len + 1))
            return -1;
        va_start(ap, fmt);
        vsnprintf((char *)(s->buf + s->size), s->allocated_size - s->size,
                  fmt, ap);
        va_end(ap);
        s->size += len;
    }
    return 0;
}